

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_12::CorruptionReporter::Corruption
          (CorruptionReporter *this,size_t bytes,Status *status)

{
  string r;
  string local_70;
  void *local_50;
  string local_48;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"corruption: ","");
  AppendNumberTo(&local_70,bytes);
  std::__cxx11::string::append((char *)&local_70);
  Status::ToString_abi_cxx11_(&local_48,status);
  std::__cxx11::string::_M_append
            ((char *)&local_70,
             CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,local_48._M_dataplus._M_p._0_4_),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::push_back((char)&local_70);
  local_48._M_dataplus._M_p._0_4_ = local_70._M_dataplus._M_p._0_4_;
  local_48._M_dataplus._M_p._4_4_ = local_70._M_dataplus._M_p._4_4_;
  local_48._M_string_length._0_4_ = (undefined4)local_70._M_string_length;
  local_48._M_string_length._4_4_ = local_70._M_string_length._4_4_;
  (*this->dst_->_vptr_WritableFile[2])(&local_50);
  if (local_50 != (void *)0x0) {
    operator_delete__(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& status) override {
    std::string r = "corruption: ";
    AppendNumberTo(&r, bytes);
    r += " bytes; ";
    r += status.ToString();
    r.push_back('\n');
    dst_->Append(r);
  }